

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match.c
# Opt level: O0

double aom_compute_correlation_c
                 (uchar *frame1,int stride1,int x1,int y1,double mean1,double one_over_stddev1,
                 uchar *frame2,int stride2,int x2,int y2,double mean2,double one_over_stddev2)

{
  double correlation;
  double covariance;
  int j;
  int i;
  int cross;
  int v2;
  int v1;
  double one_over_stddev2_local;
  double mean2_local;
  int stride2_local;
  uchar *frame2_local;
  double one_over_stddev1_local;
  double mean1_local;
  int y1_local;
  int x1_local;
  int stride1_local;
  uchar *frame1_local;
  
  cross = 0;
  for (i = 0; i < 0x10; i = i + 1) {
    for (j = 0; j < 0x10; j = j + 1) {
      cross = (uint)frame1[(i + y1 + -7) * stride1 + j + x1 + -7] *
              (uint)frame2[(i + y2 + -7) * stride2 + j + x2 + -7] + cross;
    }
  }
  return (-mean1 * mean2 + (double)cross) * one_over_stddev1 * one_over_stddev2;
}

Assistant:

double aom_compute_correlation_c(const unsigned char *frame1, int stride1,
                                 int x1, int y1, double mean1,
                                 double one_over_stddev1,
                                 const unsigned char *frame2, int stride2,
                                 int x2, int y2, double mean2,
                                 double one_over_stddev2) {
  int v1, v2;
  int cross = 0;
  for (int i = 0; i < MATCH_SZ; ++i) {
    for (int j = 0; j < MATCH_SZ; ++j) {
      v1 = frame1[(i + y1 - MATCH_SZ_BY2) * stride1 + (j + x1 - MATCH_SZ_BY2)];
      v2 = frame2[(i + y2 - MATCH_SZ_BY2) * stride2 + (j + x2 - MATCH_SZ_BY2)];
      cross += v1 * v2;
    }
  }

  // Note: In theory, the calculations here "should" be
  //   covariance = cross / N^2 - mean1 * mean2
  //   correlation = covariance / (stddev1 * stddev2).
  //
  // However, because of the scaling in aom_compute_mean_stddev, the
  // lines below actually calculate
  //   covariance * N^2 = cross - (mean1 * N) * (mean2 * N)
  //   correlation = (covariance * N^2) / ((stddev1 * N) * (stddev2 * N))
  //
  // ie. we have removed the need for a division, and still end up with the
  // correct unscaled correlation (ie, in the range [-1, +1])
  double covariance = cross - mean1 * mean2;
  double correlation = covariance * (one_over_stddev1 * one_over_stddev2);
  return correlation;
}